

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1352d2::ClangShellCommand::getVerboseDescription
          (ClangShellCommand *this,SmallVectorImpl<char> *result)

{
  pointer pSVar1;
  bool bVar2;
  size_t in_RCX;
  StringRef *arg;
  pointer pSVar3;
  StringRef string;
  raw_svector_ostream os;
  raw_svector_ostream local_50;
  
  llvm::raw_svector_ostream::raw_svector_ostream(&local_50,result);
  pSVar1 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (pSVar3 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                _M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
    if (!bVar2) {
      llvm::raw_ostream::operator<<((raw_ostream *)&local_50," ");
    }
    string.Length = in_RCX;
    string.Data = (char *)pSVar3->Length;
    llbuild::basic::appendShellEscapedString((basic *)&local_50,(raw_ostream *)pSVar3->Data,string);
    bVar2 = false;
  }
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_50);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream os(result);
    bool first = true;
    for (const auto& arg: args) {
      if (!first) os << " ";
      first = false;
      basic::appendShellEscapedString(os, arg);
    }
  }